

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.h
# Opt level: O0

WalletDatabase * __thiscall wallet::CWallet::GetDatabase(CWallet *this)

{
  long lVar1;
  bool bVar2;
  type pWVar3;
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *in_RDI;
  long in_FS_OFFSET;
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
  *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::unique_ptr::operator_cast_to_bool(in_stack_ffffffffffffffd8);
  if (!bVar2) {
    __assert_fail("static_cast<bool>(m_database)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                  ,0x1be,"virtual WalletDatabase &wallet::CWallet::GetDatabase() const");
  }
  pWVar3 = std::unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::
           operator*(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pWVar3;
  }
  __stack_chk_fail();
}

Assistant:

WalletDatabase& GetDatabase() const override
    {
        assert(static_cast<bool>(m_database));
        return *m_database;
    }